

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_allocators.cpp
# Opt level: O2

uchar * __thiscall
zmq::shared_message_memory_allocator::allocate(shared_message_memory_allocator *this)

{
  int *piVar1;
  atomic_counter_t *c;
  uchar *puVar2;
  
  piVar1 = (int *)this->_buf;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      puVar2 = this->_buf;
      if (puVar2 != (uchar *)0x0) {
        LOCK();
        puVar2[0] = '\x01';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        UNLOCK();
        puVar2 = this->_buf;
        goto LAB_00186e0c;
      }
    }
    else {
      this->_msg_content = (content_t *)0x0;
      this->_buf_size = 0;
    }
  }
  puVar2 = (uchar *)malloc(this->_max_size + this->_max_counters * 0x28 + 8);
  this->_buf = puVar2;
  if (puVar2 == (uchar *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/decoder_allocators.cpp"
            ,0x55);
    fflush(_stderr);
    zmq_abort("FATAL ERROR: OUT OF MEMORY");
    puVar2 = this->_buf;
  }
  puVar2[0] = '\x01';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
LAB_00186e0c:
  this->_buf_size = this->_max_size;
  this->_msg_content = (content_t *)(puVar2 + this->_max_size + 8);
  return puVar2 + 8;
}

Assistant:

unsigned char *zmq::shared_message_memory_allocator::allocate ()
{
    if (_buf) {
        // release reference count to couple lifetime to messages
        zmq::atomic_counter_t *c =
          reinterpret_cast<zmq::atomic_counter_t *> (_buf);

        // if refcnt drops to 0, there are no message using the buffer
        // because either all messages have been closed or only vsm-messages
        // were created
        if (c->sub (1)) {
            // buffer is still in use as message data. "Release" it and create a new one
            // release pointer because we are going to create a new buffer
            release ();
        }
    }

    // if buf != NULL it is not used by any message so we can re-use it for the next run
    if (!_buf) {
        // allocate memory for reference counters together with reception buffer
        std::size_t const allocationsize =
          _max_size + sizeof (zmq::atomic_counter_t)
          + _max_counters * sizeof (zmq::msg_t::content_t);

        _buf = static_cast<unsigned char *> (std::malloc (allocationsize));
        alloc_assert (_buf);

        new (_buf) atomic_counter_t (1);
    } else {
        // release reference count to couple lifetime to messages
        zmq::atomic_counter_t *c =
          reinterpret_cast<zmq::atomic_counter_t *> (_buf);
        c->set (1);
    }

    _buf_size = _max_size;
    _msg_content = reinterpret_cast<zmq::msg_t::content_t *> (
      _buf + sizeof (atomic_counter_t) + _max_size);
    return _buf + sizeof (zmq::atomic_counter_t);
}